

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmisaac.cpp
# Opt level: O0

void isaac_set_state(isaacctx *ctx,char *buf)

{
  unsigned_long uVar1;
  void *in_RSI;
  uint *in_RDI;
  int i;
  int local_14;
  void *local_10;
  
  uVar1 = osrp4(in_RSI);
  *in_RDI = (uint)uVar1;
  uVar1 = osrp4((void *)((long)in_RSI + 4));
  in_RDI[0x201] = (uint)uVar1;
  uVar1 = osrp4((void *)((long)in_RSI + 8));
  in_RDI[0x202] = (uint)uVar1;
  uVar1 = osrp4((void *)((long)in_RSI + 0xc));
  in_RDI[0x203] = (uint)uVar1;
  local_10 = (void *)((long)in_RSI + 0x10);
  for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
    uVar1 = osrp4(local_10);
    in_RDI[(long)local_14 + 1] = (uint)uVar1;
    uVar1 = osrp4((void *)((long)local_10 + 4));
    in_RDI[(long)local_14 + 0x101] = (uint)uVar1;
    local_10 = (void *)((long)local_10 + 8);
  }
  if (0x100 < *in_RDI) {
    *in_RDI = 0;
  }
  return;
}

Assistant:

void isaac_set_state(isaacctx *ctx, const char *buf)
{
    /* decode the buffer into our context */
    ctx->cnt = osrp4(buf); buf += 4;
    ctx->a = osrp4(buf);   buf += 4;
    ctx->b = osrp4(buf);   buf += 4;
    ctx->c = osrp4(buf);   buf += 4;
    for (int i = 0 ; i < ISAAC_RANDSIZ ; ++i, buf += 8)
    {
        ctx->rsl[i] = osrp4(buf);
        ctx->mem[i] = osrp4(buf+4);
    }

    /* sanity check the result: make sure 'cnt' is in range */
    if (ctx->cnt > ISAAC_RANDSIZ)
        ctx->cnt = 0;
}